

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,undefined8 *params,long params_1,
          long params_2,long params_3,long params_4,long params_5,long params_6,long params_7,
          undefined8 *params_8,long params_9,undefined8 *params_10,long params_11,long params_12,
          long params_13,long params_14,long params_15,long params_16,long params_17,
          undefined8 *params_18,long params_19,undefined8 *params_20,long params_21,long params_22,
          long params_23,long params_24,long params_25,long params_26,long params_27,long params_28,
          long params_29,long params_30,long params_31,undefined8 *params_32,long params_33,
          undefined8 *params_34,long params_35,long params_36,long params_37,long params_38,
          long params_39,long params_40,long params_41,long params_42,long params_43,long params_44,
          long params_45,undefined8 *params_46,long params_47,undefined8 *params_48,
          undefined8 *params_49,long params_50,long params_51,long params_52,long params_53,
          long params_54,long params_55,long params_56,long params_57,long params_58,long params_59,
          long params_60,undefined8 *params_61,long params_62,undefined8 *params_63,long params_64,
          long params_65)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  long lVar4;
  Branch *pBVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  long in_stack_000001f8;
  long in_stack_00000200;
  long in_stack_00000208;
  long in_stack_00000210;
  long in_stack_00000218;
  long in_stack_00000220;
  long in_stack_00000228;
  long in_stack_00000230;
  long in_stack_00000238;
  undefined8 *in_stack_00000240;
  long in_stack_00000248;
  undefined8 *in_stack_00000250;
  long in_stack_00000258;
  long in_stack_00000260;
  long in_stack_00000268;
  long in_stack_00000270;
  long in_stack_00000278;
  long in_stack_00000280;
  long in_stack_00000288;
  long in_stack_00000290;
  long in_stack_00000298;
  long in_stack_000002a0;
  long in_stack_000002a8;
  undefined8 *in_stack_000002b0;
  long in_stack_000002b8;
  undefined8 *in_stack_000002c0;
  long in_stack_000002c8;
  long in_stack_000002d0;
  long in_stack_000002d8;
  long in_stack_000002e0;
  long in_stack_000002e8;
  long in_stack_000002f0;
  long in_stack_000002f8;
  long in_stack_00000300;
  long in_stack_00000308;
  long in_stack_00000310;
  long in_stack_00000318;
  undefined8 *in_stack_00000320;
  long in_stack_00000328;
  String local_3b0;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined8 local_348;
  undefined8 local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined8 local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined8 local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined8 local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined8 local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined8 local_100;
  long local_f8;
  undefined1 local_f0 [16];
  undefined8 local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined8 local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined8 local_50;
  StringTree *local_40;
  undefined8 *local_38;
  
  lVar4 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  lVar7 = 0;
  lVar8 = 0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_398._8_8_ = *params;
  local_398._0_8_ = this->size_;
  local_388._8_8_ = *(undefined8 *)(params_2 + 8);
  local_388._0_8_ = *(undefined8 *)(params_1 + 8);
  local_378._8_8_ = *(undefined8 *)(params_4 + 8);
  local_378._0_8_ = *(undefined8 *)(params_3 + 8);
  local_368._8_8_ = *(undefined8 *)(params_6 + 8);
  local_368._0_8_ = *(undefined8 *)(params_5 + 8);
  local_358._8_8_ = *params_8;
  local_358._0_8_ = *(undefined8 *)(params_7 + 8);
  local_348 = *(undefined8 *)(params_9 + 8);
  local_340 = *params_10;
  local_338._8_8_ = *(undefined8 *)(params_12 + 8);
  local_338._0_8_ = *(undefined8 *)(params_11 + 8);
  local_328._8_8_ = *(undefined8 *)(params_14 + 8);
  local_328._0_8_ = *(undefined8 *)(params_13 + 8);
  local_318._8_8_ = *(undefined8 *)(params_16 + 8);
  local_318._0_8_ = *(undefined8 *)(params_15 + 8);
  local_308._8_8_ = *params_18;
  local_308._0_8_ = *(undefined8 *)(params_17 + 8);
  local_2f8 = *(undefined8 *)(params_19 + 8);
  local_2f0 = *params_20;
  local_2e8 = *(undefined8 *)(params_21 + 8);
  local_2e0 = *(long *)(params_22 + 8) + -1;
  if (*(long *)(params_22 + 8) == 0) {
    local_2e0 = lVar4;
  }
  local_2d8._8_8_ = *(undefined8 *)(params_24 + 8);
  local_2d8._0_8_ = *(undefined8 *)(params_23 + 8);
  local_2c8._8_8_ = *(undefined8 *)(params_26 + 8);
  local_2c8._0_8_ = *(undefined8 *)(params_25 + 8);
  local_2b8._8_8_ = *(undefined8 *)(params_28 + 8);
  local_2b8._0_8_ = *(undefined8 *)(params_27 + 8);
  local_2a8 = *(undefined8 *)(params_29 + 8);
  local_2a0 = *(long *)(params_30 + 8) + -1;
  if (*(long *)(params_30 + 8) == 0) {
    local_2a0 = lVar4;
  }
  local_298._8_8_ = *params_32;
  local_298._0_8_ = *(undefined8 *)(params_31 + 8);
  local_288 = *(undefined8 *)(params_33 + 8);
  local_280 = *params_34;
  local_278 = *(undefined8 *)(params_35 + 8);
  local_270 = *(long *)(params_36 + 8) + -1;
  if (*(long *)(params_36 + 8) == 0) {
    local_270 = lVar4;
  }
  local_268._8_8_ = *(undefined8 *)(params_38 + 8);
  local_268._0_8_ = *(undefined8 *)(params_37 + 8);
  local_258._8_8_ = *(undefined8 *)(params_40 + 8);
  local_258._0_8_ = *(undefined8 *)(params_39 + 8);
  local_248._8_8_ = *(undefined8 *)(params_42 + 8);
  local_248._0_8_ = *(undefined8 *)(params_41 + 8);
  local_238 = *(undefined8 *)(params_43 + 8);
  local_230 = *(long *)(params_44 + 8) + -1;
  if (*(long *)(params_44 + 8) == 0) {
    local_230 = lVar4;
  }
  local_228._8_8_ = *params_46;
  local_228._0_8_ = *(undefined8 *)(params_45 + 8);
  local_218 = *(undefined8 *)(params_47 + 8);
  local_210._8_8_ = *params_49;
  local_210._0_8_ = *params_48;
  local_200._8_8_ = *(undefined8 *)(params_51 + 8);
  local_200._0_8_ = *(undefined8 *)(params_50 + 8);
  local_1f0._8_8_ = *(undefined8 *)(params_53 + 8);
  local_1f0._0_8_ = *(undefined8 *)(params_52 + 8);
  local_1e0 = *(undefined8 *)(params_54 + 8);
  local_1d8 = *(long *)(params_55 + 8) + -1;
  if (*(long *)(params_55 + 8) == 0) {
    local_1d8 = lVar4;
  }
  local_1d0._8_8_ = *(undefined8 *)(params_57 + 8);
  local_1d0._0_8_ = *(undefined8 *)(params_56 + 8);
  local_1c0 = *(undefined8 *)(params_58 + 8);
  local_1b8 = *(long *)(params_59 + 8) + -1;
  if (*(long *)(params_59 + 8) == 0) {
    local_1b8 = lVar4;
  }
  local_1b0._8_8_ = *params_61;
  local_1b0._0_8_ = *(undefined8 *)(params_60 + 8);
  local_1a0 = *(undefined8 *)(params_62 + 8);
  local_198 = *params_63;
  local_190._8_8_ = *(undefined8 *)(params_65 + 8);
  local_190._0_8_ = *(undefined8 *)(params_64 + 8);
  local_180._8_8_ = *(undefined8 *)(in_stack_00000200 + 8);
  local_180._0_8_ = *(undefined8 *)(in_stack_000001f8 + 8);
  local_170 = *(undefined8 *)(in_stack_00000208 + 8);
  local_168 = *(long *)(in_stack_00000210 + 8) + -1;
  if (*(long *)(in_stack_00000210 + 8) == 0) {
    local_168 = lVar4;
  }
  local_160._8_8_ = *(undefined8 *)(in_stack_00000220 + 8);
  local_160._0_8_ = *(undefined8 *)(in_stack_00000218 + 8);
  local_150 = *(undefined8 *)(in_stack_00000228 + 8);
  local_148 = *(long *)(in_stack_00000230 + 8) + -1;
  if (*(long *)(in_stack_00000230 + 8) == 0) {
    local_148 = lVar4;
  }
  local_140._8_8_ = *in_stack_00000240;
  local_140._0_8_ = *(undefined8 *)(in_stack_00000238 + 8);
  local_130 = *(undefined8 *)(in_stack_00000248 + 8);
  local_128 = *in_stack_00000250;
  local_120._8_8_ = *(undefined8 *)(in_stack_00000260 + 8);
  local_120._0_8_ = *(undefined8 *)(in_stack_00000258 + 8);
  local_110._8_8_ = *(undefined8 *)(in_stack_00000270 + 8);
  local_110._0_8_ = *(undefined8 *)(in_stack_00000268 + 8);
  local_100 = *(undefined8 *)(in_stack_00000278 + 8);
  local_f8 = *(long *)(in_stack_00000280 + 8) + -1;
  if (*(long *)(in_stack_00000280 + 8) == 0) {
    local_f8 = lVar4;
  }
  local_f0._8_8_ = *(undefined8 *)(in_stack_00000290 + 8);
  local_f0._0_8_ = *(undefined8 *)(in_stack_00000288 + 8);
  local_e0 = *(undefined8 *)(in_stack_00000298 + 8);
  local_d8 = *(long *)(in_stack_000002a0 + 8) + -1;
  if (*(long *)(in_stack_000002a0 + 8) == 0) {
    local_d8 = lVar4;
  }
  local_d0._8_8_ = *in_stack_000002b0;
  local_d0._0_8_ = *(undefined8 *)(in_stack_000002a8 + 8);
  local_c0 = *(undefined8 *)(in_stack_000002b8 + 8);
  local_b8 = *in_stack_000002c0;
  local_b0 = *(undefined8 *)(in_stack_000002c8 + 8);
  local_a8 = *(long *)(in_stack_000002d0 + 8) + -1;
  if (*(long *)(in_stack_000002d0 + 8) == 0) {
    local_a8 = lVar4;
  }
  local_a0._8_8_ = *(undefined8 *)(in_stack_000002e0 + 8);
  local_a0._0_8_ = *(undefined8 *)(in_stack_000002d8 + 8);
  local_90._8_8_ = *(undefined8 *)(in_stack_000002f0 + 8);
  local_90._0_8_ = *(undefined8 *)(in_stack_000002e8 + 8);
  local_80._8_8_ = *(undefined8 *)(in_stack_00000300 + 8);
  local_80._0_8_ = *(undefined8 *)(in_stack_000002f8 + 8);
  local_70 = *(undefined8 *)(in_stack_00000308 + 8);
  local_68 = *(long *)(in_stack_00000310 + 8) + -1;
  if (*(long *)(in_stack_00000310 + 8) == 0) {
    local_68 = lVar4;
  }
  local_60._8_8_ = *in_stack_00000320;
  local_60._0_8_ = *(undefined8 *)(in_stack_00000318 + 8);
  local_50 = *(undefined8 *)(in_stack_00000328 + 8);
  do {
    lVar7 = lVar7 + *(long *)(local_398 + lVar4 * 8);
    lVar8 = lVar8 + *(long *)(local_398 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x6a);
  __return_storage_ptr__->size_ = lVar8 + lVar7;
  lVar7 = 0;
  lVar8 = 0;
  local_398 = (undefined1  [16])0x0;
  local_388._8_8_ = *(undefined8 *)(params_2 + 8);
  local_388._0_8_ = *(undefined8 *)(params_1 + 8);
  local_378._8_8_ = *(undefined8 *)(params_4 + 8);
  local_378._0_8_ = *(undefined8 *)(params_3 + 8);
  local_368._8_8_ = *(undefined8 *)(params_6 + 8);
  local_368._0_8_ = *(undefined8 *)(params_5 + 8);
  local_358._8_8_ = *params_8;
  local_358._0_8_ = *(undefined8 *)(params_7 + 8);
  local_348 = *(undefined8 *)(params_9 + 8);
  lVar4 = 0;
  local_340 = 0;
  local_338._8_8_ = *(undefined8 *)(params_12 + 8);
  local_338._0_8_ = *(undefined8 *)(params_11 + 8);
  local_328._8_8_ = *(undefined8 *)(params_14 + 8);
  local_328._0_8_ = *(undefined8 *)(params_13 + 8);
  local_318._8_8_ = *(undefined8 *)(params_16 + 8);
  local_318._0_8_ = *(undefined8 *)(params_15 + 8);
  local_308._8_8_ = *params_18;
  local_308._0_8_ = *(undefined8 *)(params_17 + 8);
  local_2f8 = *(undefined8 *)(params_19 + 8);
  local_2f0 = 0;
  local_2e8 = *(undefined8 *)(params_21 + 8);
  local_2e0 = 0;
  local_2d8._8_8_ = *(undefined8 *)(params_24 + 8);
  local_2d8._0_8_ = *(undefined8 *)(params_23 + 8);
  local_2c8._8_8_ = *(undefined8 *)(params_26 + 8);
  local_2c8._0_8_ = *(undefined8 *)(params_25 + 8);
  local_2b8._8_8_ = *(undefined8 *)(params_28 + 8);
  local_2b8._0_8_ = *(undefined8 *)(params_27 + 8);
  local_2a8 = *(undefined8 *)(params_29 + 8);
  local_2a0 = 0;
  local_298._8_8_ = *params_32;
  local_298._0_8_ = *(undefined8 *)(params_31 + 8);
  local_288 = *(undefined8 *)(params_33 + 8);
  local_280 = 0;
  local_278 = *(undefined8 *)(params_35 + 8);
  local_270 = 0;
  local_268._8_8_ = *(undefined8 *)(params_38 + 8);
  local_268._0_8_ = *(undefined8 *)(params_37 + 8);
  local_258._8_8_ = *(undefined8 *)(params_40 + 8);
  local_258._0_8_ = *(undefined8 *)(params_39 + 8);
  local_248._8_8_ = *(undefined8 *)(params_42 + 8);
  local_248._0_8_ = *(undefined8 *)(params_41 + 8);
  local_238 = *(undefined8 *)(params_43 + 8);
  local_230 = 0;
  local_228._8_8_ = *params_46;
  local_228._0_8_ = *(undefined8 *)(params_45 + 8);
  local_218 = *(undefined8 *)(params_47 + 8);
  local_210 = (undefined1  [16])0x0;
  local_200._8_8_ = *(undefined8 *)(params_51 + 8);
  local_200._0_8_ = *(undefined8 *)(params_50 + 8);
  local_1f0._8_8_ = *(undefined8 *)(params_53 + 8);
  local_1f0._0_8_ = *(undefined8 *)(params_52 + 8);
  local_1e0 = *(undefined8 *)(params_54 + 8);
  local_1d8 = 0;
  local_1d0._8_8_ = *(undefined8 *)(params_57 + 8);
  local_1d0._0_8_ = *(undefined8 *)(params_56 + 8);
  local_1c0 = *(undefined8 *)(params_58 + 8);
  local_1b8 = 0;
  local_1b0._8_8_ = *params_61;
  local_1b0._0_8_ = *(undefined8 *)(params_60 + 8);
  local_1a0 = *(undefined8 *)(params_62 + 8);
  local_198 = 0;
  local_190._8_8_ = *(undefined8 *)(params_65 + 8);
  local_190._0_8_ = *(undefined8 *)(params_64 + 8);
  local_180._8_8_ = *(undefined8 *)(in_stack_00000200 + 8);
  local_180._0_8_ = *(undefined8 *)(in_stack_000001f8 + 8);
  local_170 = *(undefined8 *)(in_stack_00000208 + 8);
  local_168 = 0;
  local_160._8_8_ = *(undefined8 *)(in_stack_00000220 + 8);
  local_160._0_8_ = *(undefined8 *)(in_stack_00000218 + 8);
  local_150 = *(undefined8 *)(in_stack_00000228 + 8);
  local_148 = 0;
  local_140._8_8_ = *in_stack_00000240;
  local_140._0_8_ = *(undefined8 *)(in_stack_00000238 + 8);
  local_130 = *(undefined8 *)(in_stack_00000248 + 8);
  local_128 = 0;
  local_120._8_8_ = *(undefined8 *)(in_stack_00000260 + 8);
  local_120._0_8_ = *(undefined8 *)(in_stack_00000258 + 8);
  local_110._8_8_ = *(undefined8 *)(in_stack_00000270 + 8);
  local_110._0_8_ = *(undefined8 *)(in_stack_00000268 + 8);
  local_100 = *(undefined8 *)(in_stack_00000278 + 8);
  local_f8 = 0;
  local_f0._8_8_ = *(undefined8 *)(in_stack_00000290 + 8);
  local_f0._0_8_ = *(undefined8 *)(in_stack_00000288 + 8);
  local_e0 = *(undefined8 *)(in_stack_00000298 + 8);
  local_d8 = 0;
  local_d0._8_8_ = *in_stack_000002b0;
  local_d0._0_8_ = *(undefined8 *)(in_stack_000002a8 + 8);
  local_c0 = *(undefined8 *)(in_stack_000002b8 + 8);
  local_b8 = 0;
  local_b0 = *(undefined8 *)(in_stack_000002c8 + 8);
  local_a8 = 0;
  local_a0._8_8_ = *(undefined8 *)(in_stack_000002e0 + 8);
  local_a0._0_8_ = *(undefined8 *)(in_stack_000002d8 + 8);
  local_90._8_8_ = *(undefined8 *)(in_stack_000002f0 + 8);
  local_90._0_8_ = *(undefined8 *)(in_stack_000002e8 + 8);
  local_80._8_8_ = *(undefined8 *)(in_stack_00000300 + 8);
  local_80._0_8_ = *(undefined8 *)(in_stack_000002f8 + 8);
  local_70 = *(undefined8 *)(in_stack_00000308 + 8);
  local_68 = 0;
  local_60._8_8_ = *in_stack_00000320;
  local_60._0_8_ = *(undefined8 *)(in_stack_00000318 + 8);
  local_50 = *(undefined8 *)(in_stack_00000328 + 8);
  do {
    lVar7 = lVar7 + *(long *)(local_398 + lVar4 * 8);
    lVar8 = lVar8 + *(long *)(local_398 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x6a);
  local_40 = this;
  local_38 = params;
  heapString(&local_3b0,lVar8 + lVar7);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar9 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar9,sVar9,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_3b0.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_3b0.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_3b0.content.disposer;
  local_398._8_8_ = 1;
  local_398._0_8_ = 1;
  lVar7 = 0;
  lVar8 = 0;
  local_388 = (undefined1  [16])0x0;
  local_378 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  lVar4 = 0;
  local_348 = 0;
  local_340 = 1;
  local_338 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = 0;
  local_2f0 = 1;
  local_2e8 = 0;
  local_2e0 = 1;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = 0;
  local_2a0 = 1;
  local_288 = 0;
  local_298 = (undefined1  [16])0x0;
  local_280 = 1;
  local_278 = 0;
  local_270 = 1;
  local_268 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = 0;
  local_230 = 1;
  local_218 = 0;
  local_228 = (undefined1  [16])0x0;
  local_210._8_8_ = 1;
  local_210._0_8_ = 1;
  local_200 = (undefined1  [16])0x0;
  local_1f0 = (undefined1  [16])0x0;
  local_1e0 = 0;
  local_1d8 = 1;
  local_1c0 = 0;
  local_1d0 = (undefined1  [16])0x0;
  local_1b8 = 1;
  local_1a0 = 0;
  local_1b0 = (undefined1  [16])0x0;
  local_198 = 1;
  local_170 = 0;
  local_180 = (undefined1  [16])0x0;
  local_190 = (undefined1  [16])0x0;
  local_168 = 1;
  local_150 = 0;
  local_160 = (undefined1  [16])0x0;
  local_148 = 1;
  local_130 = 0;
  local_140 = (undefined1  [16])0x0;
  local_128 = 1;
  local_100 = 0;
  local_110 = (undefined1  [16])0x0;
  local_120 = (undefined1  [16])0x0;
  local_f8 = 1;
  local_e0 = 0;
  local_f0 = (undefined1  [16])0x0;
  local_d8 = 1;
  local_c0 = 0;
  local_d0 = (undefined1  [16])0x0;
  local_b8 = 1;
  local_b0 = 0;
  local_a8 = 1;
  local_70 = 0;
  local_80 = (undefined1  [16])0x0;
  local_90 = (undefined1  [16])0x0;
  local_a0 = (undefined1  [16])0x0;
  local_68 = 1;
  local_50 = 0;
  local_60 = (undefined1  [16])0x0;
  do {
    lVar7 = lVar7 + *(long *)(local_398 + lVar4 * 8);
    lVar8 = lVar8 + *(long *)(local_398 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x6a);
  sVar9 = lVar8 + lVar7;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar9,sVar9,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_3b0.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_3b0.content.ptr = (char *)pBVar5;
  local_3b0.content.size_ = sVar9;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = sVar9;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_con___char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,local_40,local_38,params_1,params_2,params_3,params_4,
             params_5,params_6,params_7,params_8,params_9,params_10,params_11,params_12,params_13,
             params_14,params_15,params_16,params_17,params_18,params_19,params_20,params_21,
             params_22,params_23,params_24,params_25,params_26,params_27,params_28,params_29,
             params_30,params_31,params_32,params_33,params_34,params_35,params_36,params_37,
             params_38,params_39,params_40,params_41,params_42,params_43,params_44,params_45,
             params_46,params_47,params_48,params_49,params_50,params_51,params_52,params_53,
             params_54,params_55,params_56,params_57,params_58,params_59,params_60,params_61,
             params_62,params_63);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}